

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_stdlib.hpp
# Opt level: O3

void iutest::tuples::detail::
     tuple_foreach_impl<const_std::tuple<const_char_*,_const_char_*>,_iutest::detail::iuValueArray<const_char_*,_const_char_*>::make_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_0>
     ::impl<2,_0>::do_something
               (tuple<const_char_*,_const_char_*> *t,
               make_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *fn)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar1 = (t->super__Tuple_impl<0UL,_const_char_*,_const_char_*>).
           super__Head_base<0UL,_const_char_*,_false>._M_head_impl;
  pcVar2 = (char *)fn->val[0]._M_string_length;
  strlen(pcVar1);
  std::__cxx11::string::_M_replace((ulong)fn,0,pcVar2,(ulong)pcVar1);
  pcVar1 = (t->super__Tuple_impl<0UL,_const_char_*,_const_char_*>).
           super__Tuple_impl<1UL,_const_char_*>.super__Head_base<1UL,_const_char_*,_false>.
           _M_head_impl;
  pcVar2 = (char *)fn->val[1]._M_string_length;
  strlen(pcVar1);
  std::__cxx11::string::_M_replace((ulong)(fn->val + 1),0,pcVar2,(ulong)pcVar1);
  return;
}

Assistant:

static void do_something(T& t, F fn)
        {
            fn(I, get<I>(t));
            impl<N, I + 1>::do_something(t, fn);
        }